

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

void __thiscall kj::Path::evalPart(Path *this,Vector<kj::String> *parts,ArrayPtr<const_char> part)

{
  String *pSVar1;
  String *pSVar2;
  char *size;
  Fault __s;
  Fault f;
  Exception *pEStack_90;
  Fault f_1;
  DebugComparison<unsigned_long,_int> _kjCondition;
  Array<char> local_48;
  Array<char> local_30;
  
  size = part.ptr;
  if (size != (char *)0x0) {
    if (size == (char *)0x2) {
      if ((*(char *)&(parts->builder).ptr == '.') &&
         (*(char *)((long)&(parts->builder).ptr + 1) == '.')) {
        pSVar1 = (String *)(this->parts).size_;
        pSVar2 = (this->parts).ptr;
        _kjCondition.left = ((long)pSVar1 - (long)pSVar2) / 0x18;
        _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
        _kjCondition.op.content.ptr = " > ";
        _kjCondition.op.content.size_ = 4;
        _kjCondition.result = pSVar1 != pSVar2;
        if (!_kjCondition.result) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[50]>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x13f,FAILED,"parts.size() > 0",
                     "_kjCondition,\"can\'t use \\\"..\\\" to break out of starting directory\"",
                     &_kjCondition,
                     (char (*) [50])"can\'t use \"..\" to break out of starting directory");
          kj::_::Debug::Fault::~Fault(&f);
          return;
        }
        ArrayBuilder<kj::String>::removeLast((ArrayBuilder<kj::String> *)this);
        return;
      }
    }
    else if ((size == (char *)0x1) && (*(char *)&(parts->builder).ptr == '.')) {
      return;
    }
    heapString((String *)&f,(char *)parts,(size_t)size);
    __s.exception = pEStack_90;
    if (pEStack_90 != (Exception *)0x0) {
      __s = f;
    }
    _kjCondition.left = strlen((char *)__s.exception);
    _kjCondition._8_8_ = (undefined1 *)0x0;
    if (pEStack_90 != (Exception *)0x0) {
      _kjCondition._8_8_ = (undefined1 *)((long)&pEStack_90[-1].details.builder.disposer + 7);
    }
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = _kjCondition.left == _kjCondition._8_8_;
    if (!_kjCondition.result) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[32],kj::String&>
                (&f_1,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x146,FAILED,"strlen(str.begin()) == str.size()",
                 "_kjCondition,\"NUL character in path component\", str",
                 (DebugComparison<unsigned_long,_unsigned_long> *)&_kjCondition,
                 (char (*) [32])"NUL character in path component",(String *)&f);
      local_30.ptr = (char *)f.exception;
      f.exception = (Exception *)0x0;
      stripNul((String *)&local_48,(String *)&local_30);
      Array<char>::operator=((Array<char> *)&f,&local_48);
      Array<char>::~Array(&local_48);
      Array<char>::~Array(&local_30);
      kj::_::Debug::Fault::~Fault(&f_1);
    }
    Vector<kj::String>::add<kj::String>((Vector<kj::String> *)this,(String *)&f);
    Array<char>::~Array((Array<char> *)&f);
  }
  return;
}

Assistant:

void Path::evalPart(Vector<String>& parts, ArrayPtr<const char> part) {
  if (part.size() == 0) {
    // Ignore consecutive or trailing '/'s.
  } else if (part.size() == 1 && part[0] == '.') {
    // Refers to current directory; ignore.
  } else if (part.size() == 2 && part[0] == '.' && part [1] == '.') {
    KJ_REQUIRE(parts.size() > 0, "can't use \"..\" to break out of starting directory") {
      // When exceptions are disabled, ignore.
      return;
    }
    parts.removeLast();
  } else {
    auto str = heapString(part);
    KJ_REQUIRE(strlen(str.begin()) == str.size(), "NUL character in path component", str) {
      // When exceptions are disabled, strip out '\0' chars.
      str = stripNul(kj::mv(str));
      break;
    }
    parts.add(kj::mv(str));
  }
}